

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_bKGD(ucvector *out,LodePNGInfo *info)

{
  uint uVar1;
  uchar **in_RSI;
  uint error_2;
  uint error_1;
  uint error;
  uchar *chunk;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  long lVar2;
  
  lVar2 = 0;
  if ((*(int *)(in_RSI + 2) == 0) || (*(int *)(in_RSI + 2) == 4)) {
    uVar1 = lodepng_chunk_init(in_RSI,(ucvector *)0x0,
                               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                               (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                              );
    if (uVar1 != 0) {
      return uVar1;
    }
    *(char *)(lVar2 + 8) = (char)((uint)*(undefined4 *)((long)in_RSI + 0x3c) >> 8);
    *(char *)(lVar2 + 9) = (char)*(undefined4 *)((long)in_RSI + 0x3c);
  }
  else if ((*(int *)(in_RSI + 2) == 2) || (*(int *)(in_RSI + 2) == 6)) {
    uVar1 = lodepng_chunk_init(in_RSI,(ucvector *)0x0,
                               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                               (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                              );
    if (uVar1 != 0) {
      return uVar1;
    }
    *(char *)(lVar2 + 8) = (char)((uint)*(undefined4 *)((long)in_RSI + 0x3c) >> 8);
    *(char *)(lVar2 + 9) = (char)*(undefined4 *)((long)in_RSI + 0x3c);
    *(char *)(lVar2 + 10) = (char)((uint)*(undefined4 *)(in_RSI + 8) >> 8);
    *(char *)(lVar2 + 0xb) = (char)*(undefined4 *)(in_RSI + 8);
    *(char *)(lVar2 + 0xc) = (char)((uint)*(undefined4 *)((long)in_RSI + 0x44) >> 8);
    *(char *)(lVar2 + 0xd) = (char)*(undefined4 *)((long)in_RSI + 0x44);
  }
  else if (*(int *)(in_RSI + 2) == 3) {
    uVar1 = lodepng_chunk_init(in_RSI,(ucvector *)0x0,
                               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                               (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                              );
    if (uVar1 != 0) {
      return uVar1;
    }
    *(char *)(lVar2 + 8) = (char)*(undefined4 *)((long)in_RSI + 0x3c);
    in_stack_ffffffffffffffd4 = 0;
  }
  if (lVar2 != 0) {
    lodepng_chunk_generate_crc
              ((uchar *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  return 0;
}

Assistant:

static unsigned addChunk_bKGD(ucvector* out, const LodePNGInfo* info) {
  unsigned char* chunk = 0;
  if(info->color.colortype == LCT_GREY || info->color.colortype == LCT_GREY_ALPHA) {
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 2, "bKGD"));
    chunk[8] = (unsigned char)(info->background_r >> 8);
    chunk[9] = (unsigned char)(info->background_r & 255);
  } else if(info->color.colortype == LCT_RGB || info->color.colortype == LCT_RGBA) {
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 6, "bKGD"));
    chunk[8] = (unsigned char)(info->background_r >> 8);
    chunk[9] = (unsigned char)(info->background_r & 255);
    chunk[10] = (unsigned char)(info->background_g >> 8);
    chunk[11] = (unsigned char)(info->background_g & 255);
    chunk[12] = (unsigned char)(info->background_b >> 8);
    chunk[13] = (unsigned char)(info->background_b & 255);
  } else if(info->color.colortype == LCT_PALETTE) {
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 1, "bKGD"));
    chunk[8] = (unsigned char)(info->background_r & 255); /*palette index*/
  }
  if(chunk) lodepng_chunk_generate_crc(chunk);
  return 0;
}